

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.hpp
# Opt level: O1

void __thiscall TasGrid::GridSequence::loadGpuNodes<float>(GridSequence *this)

{
  int iVar1;
  double *pdVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  pointer __p;
  pointer __p_00;
  pointer piVar6;
  long lVar7;
  int *piVar8;
  CudaSequenceData<float> *pCVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  CudaSequenceData<float> *pCVar13;
  Data2D<int> transpoints;
  vector<int,_std::allocator<int>_> num_nodes;
  allocator_type local_59;
  _Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false> local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  vector<int,_std::allocator<int>_> local_30;
  
  if ((this->gpu_cachef)._M_t.
      super___uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
      .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl ==
      (CudaSequenceData<float> *)0x0) {
    __p_00 = (pointer)operator_new(0x50);
    (__p_00->surpluses).num_entries = 0;
    (__p_00->surpluses).gpu_data = (float *)0x0;
    (__p_00->nodes).num_entries = 0;
    (__p_00->nodes).gpu_data = (float *)0x0;
    (__p_00->coeff).num_entries = 0;
    (__p_00->coeff).gpu_data = (float *)0x0;
    (__p_00->num_nodes).num_entries = 0;
    (__p_00->num_nodes).gpu_data = (int *)0x0;
    (__p_00->points).num_entries = 0;
    (__p_00->points).gpu_data = (int *)0x0;
    local_58._M_head_impl = (CudaSequenceData<float> *)0x0;
    std::
    __uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
    ::reset((__uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
             *)&this->gpu_cachef,__p_00);
    ::std::
    unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
    ::~unique_ptr((unique_ptr<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                   *)&local_58);
  }
  pCVar13 = (this->gpu_cachef)._M_t.
            super___uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
            .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl;
  if ((pCVar13->num_nodes).num_entries == 0) {
    pdVar2 = (this->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    GpuVector<float>::load<double>
              (&pCVar13->nodes,(this->super_BaseCanonicalGrid).acceleration,
               (long)(this->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar2 >> 3,pdVar2);
    pdVar2 = (this->coeff).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    GpuVector<float>::load<double>
              (&((this->gpu_cachef)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl)->
                coeff,(this->super_BaseCanonicalGrid).acceleration,
               (long)(this->coeff).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar2 >> 3,pdVar2);
    ::std::vector<int,_std::allocator<int>_>::vector
              (&local_30,(long)(this->super_BaseCanonicalGrid).num_dimensions,
               (allocator_type *)&local_58);
    piVar3 = (this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar8 = local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    for (piVar10 = (this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start; piVar10 != piVar3; piVar10 = piVar10 + 1) {
      *piVar8 = *piVar10 + 1;
      piVar8 = piVar8 + 1;
    }
    GpuVector<int>::load
              (&((this->gpu_cachef)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl)->
                num_nodes,(this->super_BaseCanonicalGrid).acceleration,
               (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,
               local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    lVar12 = 0x18;
    if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar12 = 0x40;
    }
    iVar1 = *(int *)((long)&(this->super_BaseCanonicalGrid).acceleration + lVar12);
    pCVar13 = (CudaSequenceData<float> *)(long)iVar1;
    local_50 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
    local_58._M_head_impl = pCVar13;
    ::std::vector<int,_std::allocator<int>_>::vector(&local_48,local_50 * (long)pCVar13,&local_59);
    if (0 < iVar1) {
      lVar7 = 0;
      pCVar9 = (CudaSequenceData<float> *)0x0;
      piVar6 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if (0 < (this->super_BaseCanonicalGrid).num_dimensions) {
          lVar4 = *(long *)((long)&(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid + lVar12)
          ;
          lVar5 = *(long *)((long)&(this->super_BaseCanonicalGrid).num_dimensions + lVar12);
          lVar11 = 0;
          piVar10 = piVar6;
          do {
            *piVar10 = *(int *)(lVar4 * lVar7 + lVar5 + lVar11 * 4);
            lVar11 = lVar11 + 1;
            piVar10 = piVar10 + (long)local_58._M_head_impl;
          } while (lVar11 < (this->super_BaseCanonicalGrid).num_dimensions);
        }
        pCVar9 = (CudaSequenceData<float> *)((long)&(pCVar9->surpluses).num_entries + 1);
        lVar7 = lVar7 + 4;
        piVar6 = piVar6 + 1;
      } while (pCVar9 != pCVar13);
    }
    GpuVector<int>::load
              (&((this->gpu_cachef)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaSequenceData<float>,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaSequenceData<float>_*,_std::default_delete<TasGrid::CudaSequenceData<float>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaSequenceData<float>_*,_false>._M_head_impl)->
                points,(this->super_BaseCanonicalGrid).acceleration,
               (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,
               local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void loadGpuNodes() const{
        auto& ccache = getGpuCache<T>();
        if (!ccache) ccache = Utils::make_unique<CudaSequenceData<T>>();
        if (!ccache->num_nodes.empty()) return;

        ccache->nodes.load(acceleration, nodes);
        ccache->coeff.load(acceleration, coeff);

        std::vector<int> num_nodes(num_dimensions);
        std::transform(max_levels.begin(), max_levels.end(), num_nodes.begin(), [](int i)->int{ return i+1; });
        ccache->num_nodes.load(acceleration, num_nodes);

        const MultiIndexSet *work = (points.empty()) ? &needed : &points;
        int num_points = work->getNumIndexes();
        Data2D<int> transpoints(work->getNumIndexes(), num_dimensions);
        for(int i=0; i<num_points; i++){
            for(int j=0; j<num_dimensions; j++){
                transpoints.getStrip(j)[i] = work->getIndex(i)[j];
            }
        }
        ccache->points.load(acceleration, transpoints.begin(), transpoints.end());
    }